

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O3

Graph * raviX_init_graph(nodeId_t entry,nodeId_t exit,void *userdata,
                        C_MemoryAllocator *node_allocator)

{
  Graph *g;
  
  g = (Graph *)raviX_calloc(1,0x28);
  g->allocated = 0;
  g->nodes = (GraphNode **)0x0;
  g->node_allocator = node_allocator;
  raviX_add_node(g,entry);
  raviX_add_node(g,exit);
  g->entry = entry;
  g->exit = exit;
  g->userdata = userdata;
  return g;
}

Assistant:

Graph *raviX_init_graph(nodeId_t entry, nodeId_t exit, void *userdata, C_MemoryAllocator *node_allocator)
{
	Graph *g = (Graph *)raviX_calloc(1, sizeof(Graph));
	g->allocated = 0;
	g->nodes = NULL;
	g->node_allocator = node_allocator;
	raviX_add_node(g, entry);
	raviX_add_node(g, exit);
	g->entry = entry;
	g->exit = exit;
	g->userdata = userdata;
	return g;
}